

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

size_t string_to_size_t(string *str)

{
  size_t result;
  stringstream ss;
  size_t local_198;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(local_180,(string *)str);
  std::istream::_M_extract<unsigned_long>((ulong *)local_190);
  std::__cxx11::stringstream::~stringstream(local_190);
  return local_198;
}

Assistant:

size_t string_to_size_t(std::string str) {
    size_t result;
    std::stringstream ss;
    ss << str;
    ss >> result;
    return result;
}